

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AsyncQueue.h
# Opt level: O2

void __thiscall
nrg::detail::AsyncQueue<nrg::PrioExecution>::run(AsyncQueue<nrg::PrioExecution> *this)

{
  QueueElement *pQVar1;
  unique_lock<std::mutex> lock;
  QueueElement elem;
  unique_lock<std::mutex> local_68;
  QueueElement local_58;
  
  std::unique_lock<std::mutex>::unique_lock(&local_68,&this->guard_);
  while( true ) {
    while (pQVar1 = (this->queue_).c.
                    super__Vector_base<nrg::PrioExecution::QueueElement,_std::allocator<nrg::PrioExecution::QueueElement>_>
                    ._M_impl.super__Vector_impl_data._M_start,
          pQVar1 != (this->queue_).c.
                    super__Vector_base<nrg::PrioExecution::QueueElement,_std::allocator<nrg::PrioExecution::QueueElement>_>
                    ._M_impl.super__Vector_impl_data._M_finish) {
      PrioExecution::QueueElement::QueueElement(&local_58,pQVar1);
      std::
      priority_queue<nrg::PrioExecution::QueueElement,_std::vector<nrg::PrioExecution::QueueElement,_std::allocator<nrg::PrioExecution::QueueElement>_>,_std::greater<nrg::PrioExecution::QueueElement>_>
      ::pop(&this->queue_);
      std::unique_lock<std::mutex>::unlock(&local_68);
      std::function<void_()>::operator()(&local_58.what);
      std::unique_lock<std::mutex>::lock(&local_68);
      std::_Function_base::~_Function_base(&local_58.what.super__Function_base);
    }
    if (this->running_ != true) break;
    std::condition_variable::wait((unique_lock *)&this->cond_);
  }
  std::unique_lock<std::mutex>::~unique_lock(&local_68);
  return;
}

Assistant:

void run()
    {
        std::unique_lock<std::mutex> lock(guard_);
        while (true) {
            while (!AsyncStyle::isEmpty(queue_)) {
                typename AsyncStyle::QueueElement elem = std::move(AsyncStyle::top(queue_));
                if (AsyncStyle::isDue(elem)) {
                    AsyncStyle::pop(queue_);

                    lock.unlock();
                    try {
                        AsyncStyle::execute(elem);
                    }
                    catch(typename AsyncStyle::ExceptionType& ex) {
                        onError_(ex);
                    }
                    lock.lock();
                } else {
                    cond_.wait_for(lock, AsyncStyle::whenIsDue(elem),
                        [this](){ return AsyncStyle::isDue(AsyncStyle::top(queue_)); });
                }
            }
            if (!running_) {
                break;
            }
            cond_.wait(lock);
        }
    }